

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O1

REF_STATUS ref_oct_export_node(REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_GRID ref_grid)

{
  REF_INT *pRVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  REF_INT cell_face;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  REF_INT quad_nodes [4];
  REF_DBL box [6];
  uint local_f4;
  int local_d8;
  undefined8 local_d4;
  int local_cc;
  int local_c4;
  REF_DBL *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  int local_a0;
  int local_9c;
  int local_98 [4];
  int iStack_88;
  
  pRVar1 = ref_oct->nodes;
  iVar11 = (int)((long)node * 0x1b);
  local_c0 = bbox;
  if (ref_oct->children[node * 8] != -1) {
    lVar6 = 0;
    do {
      if ((long)pRVar1[iVar11 + lVar6] != -1) {
        bVar13 = false;
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x406
               ,"ref_oct_export_node","interor node with grid node",0xffffffffffffffff,
               (long)pRVar1[iVar11 + lVar6]);
        uVar5 = 1;
        goto LAB_00181077;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1b);
    uVar5 = 1;
    lVar6 = 0;
    do {
      RVar3 = ref_oct_child_bbox(local_c0,(REF_INT)lVar6,(REF_DBL *)&local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_oct_export_node(ref_oct,ref_oct->children[node * 8 + lVar6],(REF_DBL *)&local_a8
                                    ,ref_grid);
        bVar13 = uVar4 == 0;
        if (!bVar13) {
          bVar13 = false;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x40d,"ref_oct_export_node",(ulong)uVar4,"recurse");
          uVar5 = uVar4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x409
               ,"ref_oct_export_node",1,"bbox");
        bVar13 = false;
        uVar5 = 1;
      }
    } while ((bVar13) && (bVar14 = lVar6 != 7, lVar6 = lVar6 + 1, bVar14));
LAB_00181077:
    if (bVar13) {
      return 0;
    }
    return uVar5;
  }
  if (pRVar1[(long)iVar11 + 0x1a] == -1) {
    lVar6 = 0;
    do {
      if (pRVar1[iVar11 + lVar6] == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x336
               ,"ref_oct_export_whole","expects to be set");
        goto LAB_00181a3f;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar6 = 8;
LAB_001810a3:
    if ((long)pRVar1[iVar11 + lVar6] == -1) goto code_r0x001810b1;
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x339,
           "ref_oct_export_whole","implement 2-1",0xffffffffffffffff,(long)pRVar1[iVar11 + lVar6]);
    ref_oct_tattle(ref_oct,node);
LAB_00181a3f:
    uVar5 = 1;
    goto LAB_00181a45;
  }
  lVar6 = 0;
  do {
    if (pRVar1[iVar11 + lVar6] == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x38e,
             "ref_oct_export_steiner","expects to be set");
      uVar12 = 1;
      goto LAB_001819d5;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  dVar15 = (bbox[5] - bbox[4]) * (bbox[5] - bbox[4]) +
           (bbox[3] - bbox[2]) * (bbox[3] - bbox[2]) + (bbox[1] - *bbox) * (bbox[1] - *bbox);
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  dVar15 = dVar15 * 0.1;
  lVar6 = 0;
  local_f4 = 0;
  do {
    local_b8 = local_c0[lVar6] - ref_oct->bbox[lVar6];
    if (local_b8 <= -local_b8) {
      local_b8 = -local_b8;
    }
    uStack_b0 = 0;
    bVar13 = local_b8 < dVar15;
    cell_face = (REF_INT)lVar6;
    RVar3 = ref_oct_he2_qu2(cell_face,(REF_INT *)&local_a8);
    if (RVar3 != 0) {
      local_f4 = 1;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x396,
             "ref_oct_export_steiner",1,"qu2");
    }
    iVar10 = 1;
    if (RVar3 == 0) {
      if (ref_oct->nodes[iStack_88 + iVar11] == -1) {
        uVar5 = ref_oct_export_prism(ref_oct,node,ref_grid,(REF_INT *)&local_a8);
        if (uVar5 == 0) {
          iVar10 = 7;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x39a,"ref_oct_export_steiner",(ulong)uVar5,"whole quad pyr");
          iVar10 = 1;
          local_f4 = uVar5;
        }
        if (uVar5 == 0 && bVar13) {
          uVar5 = ref_oct_export_qua(ref_oct,node,ref_grid,(REF_INT *)&local_a8,cell_face + 1);
          if (uVar5 == 0) {
LAB_001819c1:
            iVar10 = 7;
          }
          else {
            uVar8 = 0x39e;
LAB_00181942:
            iVar10 = 1;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   uVar8,"ref_oct_export_steiner",(ulong)uVar5,"whole quad boundary qua");
            local_f4 = uVar5;
          }
        }
      }
      else {
        bVar14 = true;
        lVar7 = 0;
        do {
          if (bVar14) {
            bVar14 = ref_oct->nodes[(long)*(int *)((long)&local_a8 + lVar7 * 4) + (long)node * 0x1b]
                     != -1;
          }
          else {
            bVar14 = false;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 9);
        if (bVar14) {
          local_d8 = (int)local_a8;
          local_d4 = CONCAT44(iStack_88,local_98[0]);
          local_cc = local_98[3];
          uVar5 = ref_oct_export_prism(ref_oct,node,ref_grid,&local_d8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   0x3ab,"ref_oct_export_steiner",(ulong)uVar5,"qua 0/4");
            local_f4 = uVar5;
          }
          iVar10 = 1;
          if (uVar5 == 0) {
            if ((dVar15 <= local_b8) ||
               (uVar5 = ref_oct_export_qua(ref_oct,node,ref_grid,&local_d8,cell_face + 1),
               uVar5 == 0)) {
              local_d8 = local_a8._4_4_;
              local_d4 = CONCAT44(iStack_88,local_98[1]);
              local_cc = local_98[0];
              uVar5 = ref_oct_export_prism(ref_oct,node,ref_grid,&local_d8);
              if (uVar5 == 0) {
                if ((dVar15 <= local_b8) ||
                   (uVar5 = ref_oct_export_qua(ref_oct,node,ref_grid,&local_d8,cell_face + 1),
                   uVar5 == 0)) {
                  local_d8 = local_a0;
                  local_d4 = CONCAT44(iStack_88,local_98[2]);
                  local_cc = local_98[1];
                  uVar5 = ref_oct_export_prism(ref_oct,node,ref_grid,&local_d8);
                  if (uVar5 == 0) {
                    if ((dVar15 <= local_b8) ||
                       (uVar5 = ref_oct_export_qua(ref_oct,node,ref_grid,&local_d8,cell_face + 1),
                       uVar5 == 0)) {
                      local_d8 = local_9c;
                      local_d4 = CONCAT44(iStack_88,local_98[3]);
                      local_cc = local_98[2];
                      uVar5 = ref_oct_export_prism(ref_oct,node,ref_grid,&local_d8);
                      if (uVar5 == 0) {
                        iVar10 = 7;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                               ,0x3c6,"ref_oct_export_steiner",(ulong)uVar5,"qua 3/4");
                        iVar10 = 1;
                        local_f4 = uVar5;
                      }
                      if (uVar5 == 0 && bVar13) {
                        uVar5 = ref_oct_export_qua(ref_oct,node,ref_grid,&local_d8,cell_face + 1);
                        if (uVar5 == 0) goto LAB_001819c1;
                        uVar8 = 0x3ca;
                        goto LAB_00181942;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                             ,0x3c1,"ref_oct_export_steiner",(ulong)uVar5,"whole quad boundary qua")
                      ;
                      iVar10 = 1;
                      local_f4 = uVar5;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                           ,0x3bd,"ref_oct_export_steiner",(ulong)uVar5,"qua 2/4");
                    local_f4 = uVar5;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                         ,0x3b8,"ref_oct_export_steiner",(ulong)uVar5,"whole quad boundary qua");
                  iVar10 = 1;
                  local_f4 = uVar5;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                       ,0x3b4,"ref_oct_export_steiner",(ulong)uVar5,"qua 1/4");
                local_f4 = uVar5;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x3af,"ref_oct_export_steiner",(ulong)uVar5,"whole quad boundary qua");
              iVar10 = 1;
              local_f4 = uVar5;
            }
          }
        }
        else {
          local_c4 = cell_face + 1;
          lVar7 = 0;
          do {
            if (lVar7 == 4) {
              iVar10 = 7;
              goto LAB_0018122b;
            }
            uVar5 = (int)lVar7 + 1;
            if (lVar7 == 3) {
              uVar5 = 0;
            }
            local_d8 = *(int *)((long)&local_a8 + lVar7 * 4);
            if (ref_oct->nodes[local_98[lVar7] + iVar11] == -1) {
              local_d4 = CONCAT44(iStack_88,*(undefined4 *)((long)&local_a8 + (ulong)uVar5 * 4));
              uVar5 = ref_oct_export_tet(ref_oct,node,ref_grid,&local_d8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                       ,0x3da,"ref_oct_export_steiner",(ulong)uVar5,"tri 01");
                local_f4 = uVar5;
                goto LAB_001818c4;
              }
              if (local_b8 < dVar15) {
                uVar5 = ref_oct_export_tri(ref_oct,node,ref_grid,&local_d8,local_c4);
                if (uVar5 != 0) {
                  uVar8 = 0x3de;
LAB_001818a4:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                         ,uVar8,"ref_oct_export_steiner",(ulong)uVar5,"boundary tri");
                  local_f4 = uVar5;
                }
LAB_001818c0:
                if (uVar5 != 0) goto LAB_001818c4;
              }
LAB_001818ec:
              bVar13 = true;
            }
            else {
              local_d4 = CONCAT44(iStack_88,local_98[lVar7]);
              uVar4 = ref_oct_export_tet(ref_oct,node,ref_grid,&local_d8);
              if (uVar4 == 0) {
                if ((dVar15 <= local_b8) ||
                   (uVar4 = ref_oct_export_tri(ref_oct,node,ref_grid,&local_d8,local_c4), uVar4 == 0
                   )) {
                  local_d8 = local_98[lVar7];
                  local_d4 = CONCAT44(iStack_88,*(undefined4 *)((long)&local_a8 + (ulong)uVar5 * 4))
                  ;
                  uVar5 = ref_oct_export_tet(ref_oct,node,ref_grid,&local_d8);
                  if (uVar5 == 0) {
                    if (local_b8 < dVar15) {
                      uVar5 = ref_oct_export_tri(ref_oct,node,ref_grid,&local_d8,local_c4);
                      if (uVar5 != 0) {
                        uVar8 = 0x3ef;
                        goto LAB_001818a4;
                      }
                      goto LAB_001818c0;
                    }
                    goto LAB_001818ec;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                         ,0x3eb,"ref_oct_export_steiner",(ulong)uVar5,"tri m1");
                  local_f4 = uVar5;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                         ,999,"ref_oct_export_steiner",(ulong)uVar4,"boundary tri");
                  local_f4 = uVar4;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                       ,0x3e3,"ref_oct_export_steiner",(ulong)uVar4,"tri 0m");
                local_f4 = uVar4;
              }
LAB_001818c4:
              bVar13 = false;
            }
            lVar7 = lVar7 + 1;
          } while (bVar13);
          iVar10 = 1;
        }
      }
    }
LAB_0018122b:
    if (iVar10 != 7) {
      uVar12 = (ulong)local_f4;
      goto LAB_001819d5;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  uVar12 = 0;
LAB_001819d5:
  if ((int)uVar12 == 0) {
    return 0;
  }
  uVar8 = 0x3ff;
LAB_00181a6e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar8,
         "ref_oct_export_node",uVar12,"whole");
  return (REF_STATUS)uVar12;
code_r0x001810b1:
  lVar6 = lVar6 + 1;
  if (lVar6 == 0x1b) goto code_r0x001810ba;
  goto LAB_001810a3;
code_r0x001810ba:
  lVar6 = 0;
  do {
    *(REF_INT *)((long)&local_a8 + lVar6 * 4) = pRVar1[iVar11 + lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  uVar5 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)&local_a8,&local_d8);
  if (uVar5 == 0) {
    ref_cell = ref_grid->cell[6];
    dVar15 = (local_c0[5] - local_c0[4]) * (local_c0[5] - local_c0[4]) +
             (local_c0[3] - local_c0[2]) * (local_c0[3] - local_c0[2]) +
             (local_c0[1] - *local_c0) * (local_c0[1] - *local_c0);
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    lVar6 = 0;
    lVar7 = 0;
    do {
      dVar16 = local_c0[lVar7] - ref_oct->bbox[lVar7];
      if (dVar16 <= -dVar16) {
        dVar16 = -dVar16;
      }
      if (dVar16 < dVar15 * 0.1) {
        pRVar1 = ref_oct->nodes;
        pRVar2 = ref_grid->cell[0xb]->f2n;
        lVar9 = 0;
        do {
          iVar10 = *(int *)((long)pRVar2 + lVar9 * 4 + lVar6);
          *(int *)((long)&local_a8 + lVar9 * 4) = iVar10;
          *(REF_INT *)((long)&local_a8 + lVar9 * 4) = pRVar1[iVar10 + iVar11];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        *(int *)((long)&local_a8 + (long)ref_cell->node_per * 4) = (int)lVar7 + 1;
        uVar5 = ref_cell_add(ref_cell,(REF_INT *)&local_a8,&local_d8);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x348,"ref_oct_export_whole",(ulong)uVar5,"add quad");
          goto LAB_00181a45;
        }
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 != 6);
    uVar5 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x33c,
           "ref_oct_export_whole",(ulong)uVar5,"add hex");
  }
LAB_00181a45:
  if (uVar5 == 0) {
    return 0;
  }
  uVar12 = (ulong)uVar5;
  uVar8 = 0x3fd;
  goto LAB_00181a6e;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_export_node(REF_OCT ref_oct, REF_INT node,
                                              REF_DBL *bbox,
                                              REF_GRID ref_grid) {
  if (ref_oct_leaf_node(ref_oct, node)) {
    if (REF_EMPTY == ref_oct_c2n(ref_oct, 26, node)) {
      RSS(ref_oct_export_whole(ref_oct, node, bbox, ref_grid), "whole");
    } else {
      RSS(ref_oct_export_steiner(ref_oct, node, bbox, ref_grid), "whole");
    }
  } else {
    REF_INT i;
    REF_INT child_index;
    for (i = 0; i < 27; i++)
      REIS(REF_EMPTY, ref_oct_c2n(ref_oct, i, node),
           "interor node with grid node");
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RSS(ref_oct_export_node(ref_oct,
                              ref_oct_child(ref_oct, child_index, node), box,
                              ref_grid),
          "recurse");
    }
  }
  return REF_SUCCESS;
}